

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_36::HttpChunkedEntityWriter::write
          (HttpChunkedEntityWriter *this,int __fd,void *__buf,size_t __n)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  ArrayPtr<const_unsigned_char> *pAVar4;
  HttpOutputStream *pHVar5;
  ArrayPtr<const_unsigned_char> *piece;
  char *params_1;
  undefined8 *puVar6;
  uchar *puVar7;
  undefined4 in_register_00000034;
  unsigned_long i;
  size_t sVar8;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces;
  Promise<void> promise;
  Array<kj::ArrayPtr<const_unsigned_char>_> parts;
  String header;
  ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_> local_58;
  
  i = 0;
  params_1 = (char *)__buf;
  for (lVar3 = __n << 4; lVar3 != 0; lVar3 = lVar3 + -0x10) {
    i = i + *(long *)(params_1 + 8);
    params_1 = params_1 + 0x10;
  }
  if (i == 0) {
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else {
    hex((CappedArray<char,_17UL> *)&local_58,i);
    str<kj::CappedArray<char,17ul>,char_const(&)[3]>
              (&header,(kj *)&local_58,(CappedArray<char,_17UL> *)0x41da27,(char (*) [3])params_1);
    pAVar4 = kj::_::HeapArrayDisposer::allocateUninitialized<kj::ArrayPtr<unsigned_char_const>>
                       (__n + 2);
    local_58.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    puVar7 = (uchar *)header.content.size_;
    if (header.content.size_ != 0) {
      puVar7 = (uchar *)header.content.ptr;
    }
    sVar8 = 0;
    if (header.content.size_ != 0) {
      sVar8 = header.content.size_ - 1;
    }
    pAVar4->ptr = puVar7;
    pAVar4->size_ = sVar8;
    for (lVar3 = 0x20; __n * -0x10 + lVar3 != 0x20; lVar3 = lVar3 + 0x10) {
      puVar6 = (undefined8 *)((long)&pAVar4[-1].ptr + lVar3);
      puVar1 = (undefined8 *)((long)__buf + lVar3 + -0x20);
      uVar2 = puVar1[1];
      *puVar6 = *puVar1;
      puVar6[1] = uVar2;
    }
    *(undefined2 **)((long)&pAVar4[-1].ptr + lVar3) = &kj::_::ByteLiteral<3ul>;
    *(undefined8 *)((long)pAVar4 + lVar3 + -8) = 2;
    parts.size_ = lVar3 >> 4;
    parts.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    local_58.ptr = (ArrayPtr<const_unsigned_char> *)0x0;
    local_58.pos = (RemoveConst<kj::ArrayPtr<const_unsigned_char>_> *)0x0;
    local_58.endPtr = (ArrayPtr<const_unsigned_char> *)0x0;
    parts.ptr = pAVar4;
    pHVar5 = HttpEntityBodyWriter::getInner
                       ((HttpEntityBodyWriter *)CONCAT44(in_register_00000034,__fd));
    pieces.size_ = (size_t)pAVar4;
    pieces.ptr = (ArrayPtr<const_unsigned_char> *)pHVar5;
    HttpOutputStream::writeBodyData((HttpOutputStream *)&promise,pieces);
    Promise<void>::attach<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>
              ((Promise<void> *)this,(String *)&promise,
               (Array<kj::ArrayPtr<const_unsigned_char>_> *)&header);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
    Array<kj::ArrayPtr<const_unsigned_char>_>::~Array(&parts);
    ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_>::dispose(&local_58);
    Array<char>::~Array(&header.content);
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    uint64_t size = 0;
    for (auto& piece: pieces) size += piece.size();

    if (size == 0) return kj::READY_NOW;  // can't encode zero-size chunk since it indicates EOF.

    auto header = kj::str(kj::hex(size), "\r\n");
    auto partsBuilder = kj::heapArrayBuilder<ArrayPtr<const byte>>(pieces.size() + 2);
    partsBuilder.add(header.asBytes());
    for (auto& piece: pieces) {
      partsBuilder.add(piece);
    }
    partsBuilder.add("\r\n"_kjb);

    auto parts = partsBuilder.finish();
    auto promise = getInner().writeBodyData(parts.asPtr());
    return promise.attach(kj::mv(header), kj::mv(parts));
  }